

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

handle pybind11::detail::
       tuple_caster<std::tuple,Eigen::Array<double,-1,1,0,-1,1>,Eigen::Array<double,-1,1,0,-1,1>,Eigen::Array<double,-1,-1,0,-1,-1>,Eigen::Array<double,-1,-1,0,-1,-1>>
       ::
       cast_impl<std::tuple<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::Array<double,_1,_1,0,_1,_1>>,0ul,1ul,2ul,3ul>
                 (Array<double,__1,__1,_0,__1,__1> *src,undefined8 param_2,handle parent)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  handle hVar4;
  tuple result;
  array<pybind11::object,_4UL> entries;
  
  entries._M_elems[0].super_handle =
       type_caster<Eigen::Array<double,-1,1,0,-1,1>,void>::
       cast_impl<Eigen::Array<double,_1,1,0,_1,1>>
                 ((Array<double,__1,_1,_0,__1,_1> *)
                  &src[2].super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols,move,parent);
  entries._M_elems[1].super_handle =
       type_caster<Eigen::Array<double,-1,1,0,-1,1>,void>::
       cast_impl<Eigen::Array<double,_1,1,0,_1,1>>
                 ((Array<double,__1,_1,_0,__1,_1> *)(src + 2),move,parent);
  entries._M_elems[2].super_handle =
       type_caster<Eigen::Array<double,-1,-1,0,-1,-1>,void>::
       cast_impl<Eigen::Array<double,_1,_1,0,_1,_1>>(src + 1,move,parent);
  entries._M_elems[3].super_handle =
       type_caster<Eigen::Array<double,-1,-1,0,-1,-1>,void>::
       cast_impl<Eigen::Array<double,_1,_1,0,_1,_1>>(src,move,parent);
  hVar4.m_ptr = (PyObject *)0x0;
  lVar3 = 0;
  while (lVar3 != 0x20) {
    plVar1 = (long *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3);
    lVar3 = lVar3 + 8;
    if (*plVar1 == 0) goto LAB_0012c726;
  }
  tuple::tuple(&result,4);
  hVar4.m_ptr = (PyObject *)result;
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
    uVar2 = *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3);
    *(undefined8 *)((long)&entries._M_elems[0].super_handle.m_ptr + lVar3) = 0;
    if ((*(byte *)(*(long *)((long)result.super_object.super_handle.m_ptr + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/cast.h"
                    ,0x584,
                    "static handle pybind11::detail::tuple_caster<std::tuple, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>, T = std::tuple<Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>, Is = <0UL, 1UL, 2UL, 3UL>]"
                   );
    }
    *(undefined8 *)((long)result.super_object.super_handle.m_ptr + 0x18 + lVar3) = uVar2;
  }
  result.super_object.super_handle.m_ptr = (object)(handle)0x0;
  object::~object(&result.super_object);
LAB_0012c726:
  std::array<pybind11::object,_4UL>::~array(&entries);
  return (handle)hVar4.m_ptr;
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }